

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::reallocateAndGrow
          (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *old)

{
  QArrayData *pQVar1;
  Data *pDVar2;
  QStyleSheetPaletteData *pQVar3;
  QStyleSheetBoxData *pQVar4;
  QStyleSheetBackgroundData *pQVar5;
  QStyleSheetBorderData *pQVar6;
  QStyleSheetOutlineData *pQVar7;
  QStyleSheetGeometryData *pQVar8;
  QStyleSheetPositionData *pQVar9;
  QStyleSheetImageData *pQVar10;
  undefined8 uVar11;
  ButtonInfo *pBVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  qsizetype qVar16;
  ButtonInfo *pBVar17;
  long lVar18;
  Data *pDVar19;
  Int IVar20;
  ButtonInfo *pBVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ButtonInfo *pBVar25;
  ButtonInfo *data;
  long in_FS_OFFSET;
  undefined1 auVar26 [16];
  QArrayData *d;
  QArrayDataPointer<(anonymous_namespace)::ButtonInfo> local_58;
  QArrayData *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->d->super_QArrayData;
  if (where == GrowsAtEnd) {
    if (pQVar1 == (QArrayData *)0x0) goto LAB_00369dbc;
    if ((0 < n) && ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
      auVar26 = QArrayData::reallocateUnaligned
                          (pQVar1,this->ptr,0x98,
                           this->size +
                           ((long)((long)this->ptr -
                                  ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3)
                           * -0x79435e50d79435e5 + 1,Grow);
      this->d = (Data *)auVar26._0_8_;
      this->ptr = (ButtonInfo *)auVar26._8_8_;
      goto LAB_0036a0e4;
    }
LAB_00369de3:
    lVar23 = pQVar1->alloc;
    lVar18 = this->size;
    lVar22 = lVar18;
    if (lVar18 - lVar23 == 0 || lVar18 < lVar23) {
      lVar22 = lVar23;
    }
    lVar24 = (long)((long)this->ptr - ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0))
             >> 3;
    if (where == GrowsAtEnd) {
      lVar24 = (lVar18 - lVar23) + lVar24 * -0x79435e50d79435e5;
    }
    else {
      lVar24 = lVar24 * 0x79435e50d79435e5;
    }
    lVar24 = lVar22 + n + lVar24;
    lVar18 = lVar24;
    if (lVar24 < lVar23) {
      lVar18 = lVar23;
    }
    if (((pQVar1->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) == 0) {
      lVar18 = lVar24;
    }
  }
  else {
    if (pQVar1 != (QArrayData *)0x0) goto LAB_00369de3;
LAB_00369dbc:
    lVar23 = 0;
    lVar18 = this->size;
    if (this->size < 1) {
      lVar18 = lVar23;
    }
    lVar18 = lVar18 + n;
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (ButtonInfo *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pBVar17 = (ButtonInfo *)QArrayData::allocate(&local_40,0x98,0x10,lVar18,(uint)(lVar18 <= lVar23));
  if (pBVar17 != (ButtonInfo *)0x0 && local_40 != (QArrayData *)0x0) {
    if (where == GrowsAtBeginning) {
      lVar23 = (local_40->alloc - (n + this->size)) / 2;
      IVar20 = 0;
      if (lVar23 < 1) {
        lVar23 = 0;
      }
      pDVar19 = this->d;
      pBVar17 = pBVar17 + n + lVar23;
      if (pDVar19 != (Data *)0x0) {
LAB_00369edf:
        IVar20 = (pDVar19->super_QArrayData).flags.
                 super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
                 super_QFlagsStorage<QArrayData::ArrayOption>.i;
      }
    }
    else {
      pDVar19 = this->d;
      if (pDVar19 != (Data *)0x0) {
        pBVar17 = (ButtonInfo *)
                  ((long)pBVar17 +
                  ((long)this->ptr -
                  ((ulong)((long)&pDVar19[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)));
        goto LAB_00369edf;
      }
      IVar20 = 0;
    }
    (local_40->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
    super_QFlagsStorage<QArrayData::ArrayOption>.i = IVar20;
  }
  local_58.d = (Data *)local_40;
  local_58.size = 0;
  lVar23 = this->size;
  local_58.ptr = pBVar17;
  if (lVar23 == 0) {
LAB_0036a0ac:
    lVar23 = 0;
  }
  else if ((this->d == (Data *)0x0) ||
          (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    if (lVar23 < 1) goto LAB_0036a0ac;
    pBVar25 = this->ptr;
    pBVar21 = pBVar25 + lVar23;
    do {
      qVar16 = local_58.size;
      QRenderRule::QRenderRule(&pBVar17[local_58.size].rule,&pBVar25->rule);
      iVar13 = pBVar25->offset;
      uVar11 = *(undefined8 *)&pBVar25->where;
      pBVar12 = pBVar17 + qVar16;
      pBVar12->element = pBVar25->element;
      pBVar12->offset = iVar13;
      *(undefined8 *)(&pBVar12->element + 2) = uVar11;
      pBVar25 = pBVar25 + 1;
      lVar23 = local_58.size + 1;
      local_58.size = lVar23;
    } while (pBVar25 < pBVar21);
  }
  else {
    if (lVar23 < 1) goto LAB_0036a0ac;
    pBVar25 = this->ptr;
    pBVar21 = pBVar25 + lVar23;
    do {
      qVar16 = local_58.size;
      pBVar17[local_58.size].rule.features = (pBVar25->rule).features;
      QBrush::QBrush(&pBVar17[local_58.size].rule.defaultBackground,
                     &(pBVar25->rule).defaultBackground);
      QFont::QFont(&pBVar17[qVar16].rule.font,&(pBVar25->rule).font);
      pBVar17[qVar16].rule.hasFont = (pBVar25->rule).hasFont;
      pDVar2 = (pBVar25->rule).styleHints.d;
      (pBVar25->rule).styleHints.d = (Data *)0x0;
      pBVar17[qVar16].rule.styleHints.d = pDVar2;
      pQVar3 = (pBVar25->rule).pal.d.ptr;
      (pBVar25->rule).pal.d.ptr = (QStyleSheetPaletteData *)0x0;
      pBVar17[qVar16].rule.pal.d.ptr = pQVar3;
      pQVar4 = (pBVar25->rule).b.d.ptr;
      (pBVar25->rule).b.d.ptr = (QStyleSheetBoxData *)0x0;
      pBVar17[qVar16].rule.b.d.ptr = pQVar4;
      pQVar5 = (pBVar25->rule).bg.d.ptr;
      (pBVar25->rule).bg.d.ptr = (QStyleSheetBackgroundData *)0x0;
      pBVar17[qVar16].rule.bg.d.ptr = pQVar5;
      pQVar6 = (pBVar25->rule).bd.d.ptr;
      (pBVar25->rule).bd.d.ptr = (QStyleSheetBorderData *)0x0;
      pBVar17[qVar16].rule.bd.d.ptr = pQVar6;
      pQVar7 = (pBVar25->rule).ou.d.ptr;
      (pBVar25->rule).ou.d.ptr = (QStyleSheetOutlineData *)0x0;
      pBVar17[qVar16].rule.ou.d.ptr = pQVar7;
      pQVar8 = (pBVar25->rule).geo.d.ptr;
      (pBVar25->rule).geo.d.ptr = (QStyleSheetGeometryData *)0x0;
      pBVar17[qVar16].rule.geo.d.ptr = pQVar8;
      pQVar9 = (pBVar25->rule).p.d.ptr;
      (pBVar25->rule).p.d.ptr = (QStyleSheetPositionData *)0x0;
      pBVar17[qVar16].rule.p.d.ptr = pQVar9;
      pQVar10 = (pBVar25->rule).img.d.ptr;
      (pBVar25->rule).img.d.ptr = (QStyleSheetImageData *)0x0;
      pBVar17[qVar16].rule.img.d.ptr = pQVar10;
      pQVar10 = (pBVar25->rule).iconPtr.d.ptr;
      (pBVar25->rule).iconPtr.d.ptr = (QStyleSheetImageData *)0x0;
      pBVar17[qVar16].rule.iconPtr.d.ptr = pQVar10;
      pBVar17[qVar16].rule.clipset = (pBVar25->rule).clipset;
      QPainterPath::QPainterPath(&pBVar17[qVar16].rule.clipPath,&(pBVar25->rule).clipPath);
      iVar13 = pBVar25->offset;
      iVar14 = pBVar25->where;
      iVar15 = pBVar25->width;
      pBVar17[qVar16].element = pBVar25->element;
      pBVar17[qVar16].offset = iVar13;
      pBVar17[qVar16].where = iVar14;
      pBVar17[qVar16].width = iVar15;
      lVar23 = local_58.size + 1;
      pBVar25 = pBVar25 + 1;
      local_58.size = lVar23;
    } while (pBVar25 < pBVar21);
  }
  pDVar19 = this->d;
  this->d = local_58.d;
  pBVar17 = this->ptr;
  this->ptr = local_58.ptr;
  local_58.size = this->size;
  this->size = lVar23;
  local_58.d = pDVar19;
  local_58.ptr = pBVar17;
  ~QArrayDataPointer(&local_58);
LAB_0036a0e4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }